

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_flush(lua_State *L)

{
  int32_t idx;
  
  if ((L->base < L->top) && ((L->base->field_2).it < 0xffff0000)) {
    idx = lj_lib_checkint(L,1);
    luaJIT_setmode(L,idx,0x205);
  }
  else {
    setjitmode(L,0x200);
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_flush)
{
#if LJ_HASJIT
  if (L->base < L->top && tvisnumber(L->base)) {
    int traceno = lj_lib_checkint(L, 1);
    luaJIT_setmode(L, traceno, LUAJIT_MODE_FLUSH|LUAJIT_MODE_TRACE);
    return 0;
  }
#endif
  return setjitmode(L, LUAJIT_MODE_FLUSH);
}